

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSSpStructMatrix.cpp
# Opt level: O0

TPZMatrix<std::complex<double>_> * __thiscall
TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::SetupMatrixData
          (TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_> *this
          ,TPZStack<long,_10> *elgraph,TPZVec<long> *elgraphindex)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZMatrix<std::complex<double>_> *pTVar4;
  int64_t iVar5;
  int64_t NNodes;
  long *plVar6;
  TPZBlock *pTVar7;
  long lVar8;
  TPZVec<long> *in_RDX;
  long in_RDI;
  int colpos_3;
  int colsize_3;
  int colpos_1;
  int colsize_1;
  int colpos_2;
  int colsize_2;
  int64_t col_1;
  int64_t j_1;
  int64_t iclast_1;
  int64_t icfirst_1;
  bool diagonalinsert;
  int ibleq;
  int64_t i_2;
  TPZManVector<long,_10> rowdestindices;
  int64_t numactive_2;
  int64_t iblpos_1;
  int64_t iblsize_1;
  int i_1;
  anon_class_32_4_8a2224b8 AddColEqs;
  TPZVec<std::complex<double>_> EqValue;
  TPZVec<long> EqCol;
  TPZVec<long> Eq;
  int64_t pos;
  int64_t ieq;
  int64_t numactive_1;
  int64_t colpos;
  int64_t colsize;
  int64_t col;
  int64_t j;
  int64_t iclast;
  int64_t icfirst;
  int64_t numactive;
  int64_t iblpos;
  int64_t iblsize;
  int i;
  int64_t totaleq;
  int64_t totalvar;
  int64_t nblock;
  TPZManVector<long,_10> nodegraphindex;
  TPZManVector<long,_10> nodegraph;
  TPZRenumbering graph;
  TPZSYsmpMatrix<std::complex<double>_> *mat;
  int64_t neq;
  TPZEquationFilter *in_stack_fffffffffffffae8;
  TPZBlock *in_stack_fffffffffffffaf0;
  TPZManVector<long,_10> *pTVar9;
  TPZVec<long> *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  TPZBlock *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  TPZBlock *in_stack_fffffffffffffb18;
  TPZEquationFilter *in_stack_fffffffffffffb20;
  complex<double> *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  TPZSYsmpMatrix<std::complex<double>_> *in_stack_fffffffffffffb40;
  anon_class_32_4_8a2224b8 *this_00;
  int64_t local_360;
  int local_344;
  int64_t local_340;
  TPZManVector<long,_10> *in_stack_fffffffffffffcd0;
  TPZManVector<long,_10> *in_stack_fffffffffffffcd8;
  TPZVec<long> *in_stack_fffffffffffffce0;
  TPZVec<long> *in_stack_fffffffffffffce8;
  TPZRenumbering *in_stack_fffffffffffffcf0;
  int local_2ac;
  complex<double> local_288;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  TPZVec<long> local_238;
  TPZManVector<long,_10> *local_218;
  int64_t local_210;
  int64_t local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  int64_t local_1d0;
  long local_1c8;
  long local_1c0;
  int local_1b4;
  long local_1b0;
  anon_class_32_4_8a2224b8 *local_1a8;
  long local_1a0;
  TPZVec<long> local_198 [3];
  TPZVec<long> local_128;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  TPZRenumbering local_b8;
  TPZMatrix<std::complex<double>_> *local_28;
  int64_t local_20;
  TPZVec<long> *local_18;
  
  local_18 = in_RDX;
  local_20 = TPZEquationFilter::NActiveEquations(in_stack_fffffffffffffae8);
  pTVar4 = (TPZMatrix<std::complex<double>_> *)operator_new(0x3d8);
  TPZSYsmpMatrix<std::complex<double>_>::TPZSYsmpMatrix
            (in_stack_fffffffffffffb40,CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
             ,(int64_t)in_stack_fffffffffffffb30);
  local_28 = pTVar4;
  TPZRenumbering::TPZRenumbering
            ((TPZRenumbering *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  iVar5 = TPZVec<long>::NElements(local_18);
  NNodes = TPZCompMesh::NIndependentConnects
                     ((TPZCompMesh *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  TPZRenumbering::SetElementsNodes(&local_b8,iVar5 + -1,NNodes);
  TPZRenumbering::SetElementGraph
            ((TPZRenumbering *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             in_stack_fffffffffffffaf8,(TPZVec<long> *)in_stack_fffffffffffffaf0);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
             ,(int64_t)in_stack_fffffffffffffb08);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10)
             ,(int64_t)in_stack_fffffffffffffb08);
  TPZRenumbering::ConvertGraph
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  iVar5 = TPZVec<long>::NElements(local_198);
  local_1a0 = iVar5 + -1;
  local_1a8 = (anon_class_32_4_8a2224b8 *)0x0;
  local_1b0 = 0;
  for (local_1b4 = 0; local_1b4 < local_1a0; local_1b4 = local_1b4 + 1) {
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    iVar2 = TPZBlock::Size(in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20)
                          );
    local_1c0 = (long)iVar2;
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    iVar2 = TPZBlock::Position(in_stack_fffffffffffffaf0,
                               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    local_1c8 = (long)iVar2;
    local_1d0 = TPZEquationFilter::NumActive
                          ((TPZEquationFilter *)in_stack_fffffffffffffb08,
                           CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                           (int64_t)in_stack_fffffffffffffaf8);
    if (local_1d0 != 0) {
      local_1b0 = local_1b0 + local_1c0;
      plVar6 = TPZVec<long>::operator[](local_198,(long)local_1b4);
      local_1d8 = *plVar6;
      plVar6 = TPZVec<long>::operator[](local_198,(long)(local_1b4 + 1));
      local_1e0 = *plVar6;
      local_1a8 = (anon_class_32_4_8a2224b8 *)
                  ((long)&local_1a8->this + (local_1c0 * (local_1c0 + 1)) / 2);
      for (local_1e8 = local_1d8; local_1e8 < local_1e0; local_1e8 = local_1e8 + 1) {
        plVar6 = TPZVec<long>::operator[](&local_128,local_1e8);
        local_1f0 = *plVar6;
        if (local_1b4 <= local_1f0) {
          if (local_1f0 == local_1b4) {
            pzinternal::DebugStopImpl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          }
          TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
          iVar2 = TPZBlock::Size(in_stack_fffffffffffffaf0,
                                 (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_1f8 = (long)iVar2;
          TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
          iVar2 = TPZBlock::Position(in_stack_fffffffffffffaf0,
                                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          local_200 = (long)iVar2;
          local_208 = TPZEquationFilter::NumActive
                                ((TPZEquationFilter *)in_stack_fffffffffffffb08,
                                 CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                                 (int64_t)in_stack_fffffffffffffaf8);
          if (local_208 != 0) {
            local_1a8 = (anon_class_32_4_8a2224b8 *)((long)&local_1a8->this + local_1c0 * local_1f8)
            ;
          }
        }
      }
    }
  }
  local_210 = 0;
  local_218 = (TPZManVector<long,_10> *)0x0;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8)
  ;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8)
  ;
  this_00 = local_1a8;
  std::complex<double>::complex(&local_288,0.0,0.0);
  TPZVec<std::complex<double>_>::TPZVec
            ((TPZVec<std::complex<double>_> *)in_stack_fffffffffffffb40,
             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),in_stack_fffffffffffffb30
            );
  for (local_2ac = 0; local_2ac < local_1a0; local_2ac = local_2ac + 1) {
    pTVar7 = TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    iVar2 = TPZBlock::Size(in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20)
                          );
    lVar8 = (long)iVar2;
    TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
    iVar3 = TPZBlock::Position(in_stack_fffffffffffffaf0,
                               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
    iVar5 = TPZEquationFilter::NumActive
                      ((TPZEquationFilter *)in_stack_fffffffffffffb08,
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                       (int64_t)in_stack_fffffffffffffaf8);
    if (iVar5 != 0) {
      TPZManVector<long,_10>::TPZManVector
                ((TPZManVector<long,_10> *)
                 CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                 (int64_t)in_stack_fffffffffffffb08);
      for (local_340 = 0; local_340 < lVar8; local_340 = local_340 + 1) {
        plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)&stack0xfffffffffffffcc8,local_340);
        *plVar6 = iVar3 + local_340;
      }
      TPZEquationFilter::Filter(in_stack_fffffffffffffb20,(TPZVec<long> *)in_stack_fffffffffffffb18)
      ;
      for (local_344 = 0; iVar5 = TPZVec<long>::size((TPZVec<long> *)&stack0xfffffffffffffcc8),
          local_344 < iVar5; local_344 = local_344 + 1) {
        plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)&stack0xfffffffffffffcc8,(long)local_344);
        if (*plVar6 != local_210) {
          pzinternal::DebugStopImpl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        pTVar9 = local_218;
        plVar6 = TPZVec<long>::operator[](&local_238,local_210);
        *plVar6 = (long)pTVar9;
        bVar1 = false;
        plVar6 = TPZVec<long>::operator[](local_198,(long)local_2ac);
        local_360 = *plVar6;
        plVar6 = TPZVec<long>::operator[](local_198,(long)(local_2ac + 1));
        lVar8 = *plVar6;
        for (; local_360 < lVar8; local_360 = local_360 + 1) {
          plVar6 = TPZVec<long>::operator[](&local_128,local_360);
          if ((long)local_2ac <= *plVar6) {
            if ((!bVar1) && ((long)local_2ac < *plVar6)) {
              bVar1 = true;
              TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
              TPZBlock::Size(in_stack_fffffffffffffaf0,
                             (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
              TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
              TPZBlock::Position(in_stack_fffffffffffffaf0,
                                 (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
              SetupMatrixData::anon_class_32_4_8a2224b8::operator()
                        (this_00,(int)((ulong)pTVar7 >> 0x20),(int)pTVar7,iVar2);
            }
            TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
            TPZBlock::Size(in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20)
                          );
            TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
            TPZBlock::Position(in_stack_fffffffffffffaf0,
                               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
            in_stack_fffffffffffffb20 =
                 (TPZEquationFilter *)
                 TPZEquationFilter::NumActive
                           ((TPZEquationFilter *)in_stack_fffffffffffffb08,
                            CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                            (int64_t)in_stack_fffffffffffffaf8);
            if (in_stack_fffffffffffffb20 != (TPZEquationFilter *)0x0) {
              SetupMatrixData::anon_class_32_4_8a2224b8::operator()
                        (this_00,(int)((ulong)pTVar7 >> 0x20),(int)pTVar7,iVar2);
            }
          }
        }
        if (!bVar1) {
          in_stack_fffffffffffffb18 = TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
          in_stack_fffffffffffffb14 =
               TPZBlock::Size(in_stack_fffffffffffffaf0,
                              (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          in_stack_fffffffffffffb08 = TPZCompMesh::Block(*(TPZCompMesh **)(in_RDI + 8));
          in_stack_fffffffffffffb04 =
               TPZBlock::Position(in_stack_fffffffffffffaf0,
                                  (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
          SetupMatrixData::anon_class_32_4_8a2224b8::operator()
                    (this_00,(int)((ulong)pTVar7 >> 0x20),(int)pTVar7,iVar2);
        }
        local_210 = local_210 + 1;
      }
      TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_fffffffffffffaf0);
    }
  }
  pTVar9 = local_218;
  plVar6 = TPZVec<long>::operator[](&local_238,local_210);
  *plVar6 = (long)pTVar9;
  (*(local_28->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x4f])
            (local_28,&local_238,local_258,local_278);
  pTVar4 = local_28;
  TPZVec<std::complex<double>_>::~TPZVec((TPZVec<std::complex<double>_> *)pTVar9);
  TPZVec<long>::~TPZVec(&pTVar9->super_TPZVec<long>);
  TPZVec<long>::~TPZVec(&pTVar9->super_TPZVec<long>);
  TPZManVector<long,_10>::~TPZManVector(pTVar9);
  TPZManVector<long,_10>::~TPZManVector(pTVar9);
  TPZRenumbering::~TPZRenumbering((TPZRenumbering *)0x1daff5d);
  return pTVar4;
}

Assistant:

TPZMatrix<TVar> * TPZSSpStructMatrix<TVar,TPar>::SetupMatrixData(TPZStack<int64_t> & elgraph, TPZVec<int64_t> &elgraphindex){
    
    const int64_t neq = this->fEquationFilter.NActiveEquations();
    TPZSYsmpMatrix<TVar> * mat = new TPZSYsmpMatrix<TVar>(neq,neq);
    
    /**Creates a element graph*/
    TPZRenumbering graph;
    graph.SetElementsNodes(elgraphindex.NElements() -1
                           ,this->fMesh->NIndependentConnects());
    graph.SetElementGraph(elgraph,elgraphindex);
    
    TPZManVector<int64_t> nodegraph;
    TPZManVector<int64_t> nodegraphindex;
    /**
     *converts an element graph structure into a node graph structure
     *those vectors have size ZERO !!!
     */
    graph.ConvertGraph(elgraph,elgraphindex,nodegraph,nodegraphindex);
    /**vector sizes*/
    const int64_t nblock = nodegraphindex.NElements()-1;
    // number of values in the sparse matrix
    int64_t totalvar = 0;
    // number of equations
    int64_t totaleq = 0;
    for(auto i=0;i<nblock;i++){
        const int64_t iblsize = this->fMesh->Block().Size(i);
        const int64_t iblpos = this->fMesh->Block().Position(i);
        const int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        totaleq += iblsize;
        const int64_t icfirst = nodegraphindex[i];
        const int64_t iclast = nodegraphindex[i+1];
        //longhin
        totalvar+=(iblsize*(iblsize+1))/2;
        for(auto j=icfirst;j<iclast;j++) {
            const int64_t col = nodegraph[j];
            if (col < i) {
                continue;
            }
            
            if (col == i) {
                DebugStop();
            }
            
            const int64_t colsize = this->fMesh->Block().Size(col);
            const int64_t colpos = this->fMesh->Block().Position(col);
            const int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
            if (!numactive) {
                continue;
            }
            totalvar += iblsize*colsize;
        }
    }
    
    int64_t ieq = 0;
    // pos is the position where we will put the column value
    int64_t pos = 0;
    
    TPZVec<int64_t> Eq(totaleq+1);
    TPZVec<int64_t> EqCol(totalvar);
    TPZVec<TVar> EqValue(totalvar,0.);
    //lambda for avoid repeating code
    //lambda for avoid repeating code
    auto AddColEqs =
        [this,&EqCol,&EqValue,&pos](const int colsize, const int colpos, const int ieq)
        {
            TPZManVector<int64_t> destindices(colsize);
            for (int64_t i=0; i<colsize; i++) {
                destindices[i] = colpos+i;
            }
            this->fEquationFilter.Filter(destindices);
            for(auto jbleq=0; jbleq<destindices.size(); jbleq++) {
                const int64_t jeq = destindices[jbleq];
                if (jeq < ieq) {
                    continue;
                }
                EqCol[pos] = destindices[jbleq];
                EqValue[pos] = 0.;
                pos++;
            }
        };
    
    for(auto i=0;i<nblock;i++){
        const int64_t iblsize = this->fMesh->Block().Size(i);
        const int64_t iblpos = this->fMesh->Block().Position(i);
        const int64_t numactive =
            this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        TPZManVector<int64_t> rowdestindices(iblsize);
        for (int64_t i=0; i<iblsize; i++) {
            rowdestindices[i] = iblpos+i;
        }
        this->fEquationFilter.Filter(rowdestindices);
        // working equation by equation
        for(auto ibleq=0; ibleq<rowdestindices.size(); ibleq++) {
            if (rowdestindices[ibleq] != ieq) {
                DebugStop();
            }
            Eq[ieq] = pos;
            bool diagonalinsert = false;
            const int64_t icfirst = nodegraphindex[i];
            const int64_t iclast = nodegraphindex[i+1];
            for(auto j=icfirst;j<iclast;j++)
            {
                const int64_t col = nodegraph[j];
                if (col < i) {
                    continue;
                }
                // force the diagonal block to be inserted
                // the nodegraph does not contain the pointer to itself
                if(!diagonalinsert && col > i)
                {
                    diagonalinsert = true;
                    const auto colsize = this->fMesh->Block().Size(i);
                    const auto colpos = this->fMesh->Block().Position(i);
                    AddColEqs(colsize,colpos,ieq);
                }
                const auto colsize = this->fMesh->Block().Size(col);
                const auto colpos = this->fMesh->Block().Position(col);
                if (this->fEquationFilter.NumActive(colpos, colpos+colsize) == 0) {
                    continue;
                }
                AddColEqs(colsize,colpos,ieq);
            }
            // all elements are below (last block certainly)
            if(!diagonalinsert)
            {
                diagonalinsert = true;
                const auto colsize = this->fMesh->Block().Size(i);
                const auto colpos = this->fMesh->Block().Position(i);
                AddColEqs(colsize,colpos,ieq);
            }
            ieq++;
        }
    }

    Eq[ieq] = pos;
    mat->SetData(Eq,EqCol,EqValue);
    return mat;
}